

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O1

void __thiscall
tcu::ScopedLogSection::ScopedLogSection
          (ScopedLogSection *this,TestLog *log,string *name,string *description)

{
  LogSection local_50;
  
  this->m_log = log;
  LogSection::LogSection(&local_50,name,description);
  TestLog::startSection
            (log,local_50.m_name._M_dataplus._M_p,local_50.m_description._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_description._M_dataplus._M_p != &local_50.m_description.field_2) {
    operator_delete(local_50.m_description._M_dataplus._M_p,
                    local_50.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_name._M_dataplus._M_p != &local_50.m_name.field_2) {
    operator_delete(local_50.m_name._M_dataplus._M_p,
                    local_50.m_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ScopedLogSection (TestLog& log, const std::string& name, const std::string& description)
		: m_log(log)
	{
		m_log << TestLog::Section(name, description);
	}